

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<unsigned_long,std::__cxx11::string,char*>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,unsigned_long param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,char *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> vStack_88;
  undefined1 local_68 [56];
  
  params_00 = params;
  ExceptionFormatValue::ExceptionFormatValue((ExceptionFormatValue *)local_68,(int64_t)values);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)local_68);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x18));
  ::std::__cxx11::string::string((string *)&vStack_88,(string *)param);
  ConstructMessageRecursive<std::__cxx11::string,char*>
            (__return_storage_ptr__,this,msg,&vStack_88,params,(char *)params_00);
  ::std::__cxx11::string::~string((string *)&vStack_88);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}